

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioDiagDialog.cpp
# Opt level: O2

void __thiscall
AudioDiagDialog::AudioDiagDialog(AudioDiagDialog *this,Renderer *renderer,QWidget *parent)

{
  QVBoxLayout *this_00;
  QFormLayout *this_01;
  QHBoxLayout *this_02;
  QSpinBox *this_03;
  QPushButton *this_04;
  undefined4 *puVar1;
  ulong uVar2;
  int *piVar3;
  QArrayDataPointer<char16_t> local_c8;
  QCheckBox *local_b0;
  QProgressBar *local_a8;
  QPushButton *local_a0;
  QPushButton *local_98;
  QLayout *local_90;
  QLabel *local_88;
  QLabel *local_80;
  QLabel *local_78;
  QLabel *local_70;
  QLabel *local_68;
  QVBoxLayout *local_60;
  QObject local_58 [8];
  QObject local_50 [8];
  Object local_48 [8];
  Object local_40 [8];
  Object local_38 [8];
  
  QDialog::QDialog(&this->super_QDialog,parent,0x8003000);
  *(undefined ***)this = &PTR_metaObject_001f2160;
  *(undefined ***)&this->field_0x10 = &PTR__AudioDiagDialog_001f2338;
  this->mRenderer = renderer;
  this->mTimerId = -1;
  this->mLastIsRunning = true;
  this_00 = &this->mLayout;
  QVBoxLayout::QVBoxLayout(this_00);
  local_60 = this_00;
  tr((QString *)&local_c8,"Render statistics",(char *)0x0,-1);
  local_90 = (QLayout *)&this->mRenderGroup;
  QGroupBox::QGroupBox((QGroupBox *)local_90,(QString *)&local_c8,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  this_01 = &this->mRenderLayout;
  QFormLayout::QFormLayout(this_01,(QWidget *)0x0);
  local_68 = &this->mUnderrunLabel;
  QLabel::QLabel(local_68,0,0);
  local_a8 = &this->mBufferProgress;
  QProgressBar::QProgressBar(local_a8,(QWidget *)0x0);
  local_70 = &this->mStatusLabel;
  QLabel::QLabel(local_70,0,0);
  local_78 = &this->mElapsedLabel;
  QLabel::QLabel(local_78,0,0);
  local_80 = &this->mPeriodLabel;
  QLabel::QLabel(local_80,0,0);
  local_88 = &this->mPeriodWrittenLabel;
  QLabel::QLabel(local_88,0,0);
  tr((QString *)&local_c8,"Clear",(char *)0x0,-1);
  local_98 = &this->mClearButton;
  QPushButton::QPushButton(local_98,(QString *)&local_c8,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  this_02 = &this->mButtonLayout;
  QHBoxLayout::QHBoxLayout(this_02);
  tr((QString *)&local_c8,"Auto refresh",(char *)0x0,-1);
  local_b0 = &this->mAutoRefreshCheck;
  QCheckBox::QCheckBox(local_b0,(QString *)&local_c8,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  this_03 = &this->mIntervalSpin;
  QSpinBox::QSpinBox(this_03,(QWidget *)0x0);
  tr((QString *)&local_c8,"Refresh",(char *)0x0,-1);
  local_a0 = &this->mRefreshButton;
  QPushButton::QPushButton(local_a0,(QString *)&local_c8,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  tr((QString *)&local_c8,"Close",(char *)0x0,-1);
  this_04 = &this->mCloseButton;
  QPushButton::QPushButton(this_04,(QString *)&local_c8,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  tr((QString *)&local_c8,"Underruns",(char *)0x0,-1);
  QFormLayout::addRow((QString *)this_01,(QWidget *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  tr((QString *)&local_c8,"Buffer usage",(char *)0x0,-1);
  QFormLayout::addRow((QString *)this_01,(QWidget *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  tr((QString *)&local_c8,"Status",(char *)0x0,-1);
  QFormLayout::addRow((QString *)this_01,(QWidget *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  tr((QString *)&local_c8,"Elapsed",(char *)0x0,-1);
  QFormLayout::addRow((QString *)this_01,(QWidget *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  tr((QString *)&local_c8,"Refresh rate",(char *)0x0,-1);
  QFormLayout::addRow((QString *)this_01,(QWidget *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  tr((QString *)&local_c8,"Samples written",(char *)0x0,-1);
  QFormLayout::addRow((QString *)this_01,(QWidget *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QFormLayout::setWidget((int)this_01,6,(QWidget *)0x0);
  QWidget::setLayout(local_90);
  QBoxLayout::addWidget(this_02,local_b0,0,0);
  QBoxLayout::addWidget(this_02,this_03,0,0);
  QBoxLayout::addWidget(this_02,local_a0,0,0);
  QBoxLayout::addStretch((int)this_02);
  QBoxLayout::addWidget(this_02,this_04,0,0);
  QBoxLayout::addWidget(this_00,local_90,1,0);
  QBoxLayout::addLayout((QLayout *)this_00,(int)this_02);
  QLayout::setSizeConstraint((SizeConstraint)this_00);
  QWidget::setLayout((QLayout *)this);
  tr((QString *)&local_c8," ms",(char *)0x0,-1);
  QSpinBox::setSuffix((QString *)this_03);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QSpinBox::setRange((int)this_03,10);
  QSpinBox::setValue((int)this_03);
  QCheckBox::setCheckState((CheckState)local_b0);
  QProgressBar::setAlignment(local_a8,0x84);
  tr((QString *)&local_c8,"%p% (%v / %m samples)",(char *)0x0,-1);
  QProgressBar::setFormat((QString *)local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QPushButton::setDefault(SUB81(this_04,0));
  setElapsed(this,0);
  setRunningLabel(this,false);
  tr((QString *)&local_c8,"Audio diagnostics",(char *)0x0,-1);
  QWidget::setWindowTitle((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  local_c8.d = (Data *)QWidget::close;
  local_c8.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),bool(QWidget::*)()>
            (local_38,(offset_in_QAbstractButton_to_subr)this_04,(Object *)QAbstractButton::clicked,
             0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  local_c8.d = (Data *)refresh;
  local_c8.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),void(AudioDiagDialog::*)()>
            (local_40,(offset_in_QAbstractButton_to_subr)local_a0,(Object *)QAbstractButton::clicked
             ,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  local_c8.d = (Data *)Renderer::clearDiagnostics;
  local_c8.ptr = (char16_t *)0x0;
  uVar2 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(Renderer::*)()>
            (local_48,(offset_in_QAbstractButton_to_subr)local_98,(Object *)QAbstractButton::clicked
             ,0,(ConnectionType)this->mRenderer);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  local_c8.d = (Data *)QCheckBox::stateChanged;
  local_c8.ptr = (char16_t *)0x0;
  puVar1 = (undefined4 *)operator_new(0x18);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/AudioDiagDialog.cpp:73:9),_1,_QtPrivate::List<int>,_void>
       ::impl;
  *(AudioDiagDialog **)(puVar1 + 4) = this;
  piVar3 = (int *)(uVar2 & 0xffffffff00000000);
  QObject::connectImpl
            (local_50,(void **)local_b0,(QObject *)&local_c8,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar1,piVar3,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  local_c8.d = (Data *)QSpinBox::valueChanged;
  local_c8.ptr = (char16_t *)0x0;
  puVar1 = (undefined4 *)operator_new(0x18);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/AudioDiagDialog.cpp:83:9),_1,_QtPrivate::List<int>,_void>
       ::impl;
  *(AudioDiagDialog **)(puVar1 + 4) = this;
  QObject::connectImpl
            (local_58,(void **)this_03,(QObject *)&local_c8,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar1,(int *)((ulong)piVar3 & 0xffffffff00000000),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  return;
}

Assistant:

AudioDiagDialog::AudioDiagDialog(Renderer &renderer, QWidget *parent) :
    QDialog(parent, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint),
    mRenderer(renderer),
    mTimerId(-1),
    mLastIsRunning(true),
    mLayout(),
    mRenderGroup(tr("Render statistics")),
    mRenderLayout(),
    mUnderrunLabel(),
    mBufferProgress(),
    mStatusLabel(),
    mElapsedLabel(),
    mPeriodLabel(),
    mPeriodWrittenLabel(),
    mClearButton(tr("Clear")),
    mButtonLayout(),
    mAutoRefreshCheck(tr("Auto refresh")),
    mIntervalSpin(),
    mRefreshButton(tr("Refresh")),
    mCloseButton(tr("Close"))
{
    mRenderLayout.addRow(tr("Underruns"), &mUnderrunLabel);
    mRenderLayout.addRow(tr("Buffer usage"), &mBufferProgress);
    mRenderLayout.addRow(tr("Status"), &mStatusLabel);
    mRenderLayout.addRow(tr("Elapsed"), &mElapsedLabel);
    mRenderLayout.addRow(tr("Refresh rate"), &mPeriodLabel);
    mRenderLayout.addRow(tr("Samples written"), &mPeriodWrittenLabel);
    mRenderLayout.setWidget(6, QFormLayout::LabelRole, &mClearButton);
    mRenderGroup.setLayout(&mRenderLayout);

    mButtonLayout.addWidget(&mAutoRefreshCheck);
    mButtonLayout.addWidget(&mIntervalSpin);
    mButtonLayout.addWidget(&mRefreshButton);
    mButtonLayout.addStretch();
    mButtonLayout.addWidget(&mCloseButton);

    mLayout.addWidget(&mRenderGroup, 1);
    mLayout.addLayout(&mButtonLayout);
    mLayout.setSizeConstraint(QLayout::SizeConstraint::SetFixedSize);
    setLayout(&mLayout);

    mIntervalSpin.setSuffix(tr(" ms"));
    mIntervalSpin.setRange(10, 60000);
    mIntervalSpin.setValue(TU::DEFAULT_REFRESH_INTERVAL);

    mAutoRefreshCheck.setCheckState(Qt::Checked);

    mBufferProgress.setAlignment(Qt::AlignCenter);
    mBufferProgress.setFormat(tr("%p% (%v / %m samples)"));

    mCloseButton.setDefault(true);

    setElapsed(0);
    setRunningLabel(false);
    setWindowTitle(tr("Audio diagnostics"));

    connect(&mCloseButton, &QPushButton::clicked, this, &AudioDiagDialog::close);
    connect(&mRefreshButton, &QPushButton::clicked, this, &AudioDiagDialog::refresh);
    connect(&mClearButton, &QPushButton::clicked, &mRenderer, &Renderer::clearDiagnostics);
    connect(&mAutoRefreshCheck, &QCheckBox::stateChanged, this,
        [this](int state) {
            bool checked = state == Qt::Checked;
            mIntervalSpin.setEnabled(checked);
            if (checked) {
                mTimerId = startTimer(mIntervalSpin.value());
            } else {
                killTimer(mTimerId);
            }
        });
    connect(&mIntervalSpin, qOverload<int>(&QSpinBox::valueChanged), this,
        [this](int value) {
            if (mTimerId != -1) {
                killTimer(mTimerId);
                mTimerId = startTimer(value);
            }
        });
    
}